

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitCastExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,CastExpr *expr)

{
  int iVar1;
  type expr_00;
  pointer pTVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  CastExpr *local_20;
  CastExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (CastExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::operator+(&local_c0,"(",&(expr->oper).lexeme);
  std::operator+(&local_a0,&local_c0," ");
  expr_00 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                      (&local_20->expr);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_f0,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,expr_00);
  std::operator+(&local_80,&local_a0,&local_f0);
  std::operator+(&local_60,&local_80," ");
  pTVar2 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&local_20->typename_);
  iVar1 = (*pTVar2->_vptr_Typename[4])();
  std::operator+(&local_40,&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+(__return_storage_ptr__,&local_40,")");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitCastExpr(CastExpr& expr) {
        return "(" + expr.oper.lexeme + " " + visitExpr(*expr.expr) + " " + expr.typename_->name() + ")";
    }